

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btStridingMeshInterfaceData * __thiscall
btCollisionWorldImporter::createStridingMeshInterfaceData
          (btCollisionWorldImporter *this,btStridingMeshInterfaceData *interfaceData)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  btStridingMeshInterfaceData *pbVar8;
  ulong uVar9;
  btMeshPartData *pbVar10;
  long *plVar11;
  btVector3FloatData *pbVar12;
  btVector3DoubleData *pbVar13;
  btIntIndexData *pbVar14;
  btShortIntIndexTripletData *pbVar15;
  btShortIntIndexData *pbVar16;
  btCharIndexTripletData *pbVar17;
  long *in_RSI;
  bool uninitialized3indices8Workaround;
  int numIndices;
  btMeshPartData *curNewPart;
  btMeshPartData *curPart;
  int i;
  btStridingMeshInterfaceData *newData;
  uint in_stack_ffffffffffffffc8;
  uint uVar18;
  int in_stack_ffffffffffffffcc;
  btMeshPartData *in_stack_ffffffffffffffd0;
  int local_1c;
  
  pbVar8 = (btStridingMeshInterfaceData *)::operator_new(0x20);
  *(long *)(pbVar8->m_scaling).m_floats = in_RSI[1];
  *(long *)((pbVar8->m_scaling).m_floats + 2) = in_RSI[2];
  pbVar8->m_numMeshParts = (int)in_RSI[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)pbVar8->m_numMeshParts;
  uVar9 = SUB168(auVar1 * ZEXT816(0x38),0);
  if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pbVar10 = (btMeshPartData *)operator_new__(uVar9);
  pbVar8->m_meshPartsPtr = pbVar10;
  for (local_1c = 0; local_1c < pbVar8->m_numMeshParts; local_1c = local_1c + 1) {
    plVar11 = (long *)(*in_RSI + (long)local_1c * 0x38);
    in_stack_ffffffffffffffd0 = pbVar8->m_meshPartsPtr + local_1c;
    in_stack_ffffffffffffffd0->m_numTriangles = (int)plVar11[6];
    in_stack_ffffffffffffffd0->m_numVertices = *(int *)((long)plVar11 + 0x34);
    if (*plVar11 == 0) {
      in_stack_ffffffffffffffd0->m_vertices3f = (btVector3FloatData *)0x0;
      uVar18 = in_stack_ffffffffffffffc8;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)in_stack_ffffffffffffffd0->m_numVertices;
      uVar9 = SUB168(auVar2 * ZEXT816(0x10),0);
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pbVar12 = (btVector3FloatData *)operator_new__(uVar9);
      in_stack_ffffffffffffffd0->m_vertices3f = pbVar12;
      memcpy(in_stack_ffffffffffffffd0->m_vertices3f,(void *)*plVar11,
             (long)in_stack_ffffffffffffffd0->m_numVertices << 4);
      uVar18 = in_stack_ffffffffffffffc8;
    }
    if (plVar11[1] == 0) {
      in_stack_ffffffffffffffd0->m_vertices3d = (btVector3DoubleData *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)in_stack_ffffffffffffffd0->m_numVertices;
      uVar9 = SUB168(auVar3 * ZEXT816(0x20),0);
      if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pbVar13 = (btVector3DoubleData *)operator_new__(uVar9);
      in_stack_ffffffffffffffd0->m_vertices3d = pbVar13;
      memcpy(in_stack_ffffffffffffffd0->m_vertices3d,(void *)plVar11[1],
             (long)in_stack_ffffffffffffffd0->m_numVertices << 5);
    }
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffd0->m_numTriangles * 3;
    in_stack_ffffffffffffffc8 = uVar18 & 0xffffff;
    if (plVar11[2] == 0) {
      in_stack_ffffffffffffffd0->m_indices32 = (btIntIndexData *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 = CONCAT13(1,(int3)uVar18);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)in_stack_ffffffffffffffcc;
      uVar9 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pbVar14 = (btIntIndexData *)operator_new__(uVar9);
      in_stack_ffffffffffffffd0->m_indices32 = pbVar14;
      memcpy(in_stack_ffffffffffffffd0->m_indices32,(void *)plVar11[2],
             (long)in_stack_ffffffffffffffcc << 2);
    }
    if (plVar11[3] == 0) {
      in_stack_ffffffffffffffd0->m_3indices16 = (btShortIntIndexTripletData *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)in_stack_ffffffffffffffd0->m_numTriangles;
      uVar9 = SUB168(auVar5 * ZEXT816(8),0);
      if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pbVar15 = (btShortIntIndexTripletData *)operator_new__(uVar9);
      in_stack_ffffffffffffffd0->m_3indices16 = pbVar15;
      memcpy(in_stack_ffffffffffffffd0->m_3indices16,(void *)plVar11[3],
             (long)in_stack_ffffffffffffffd0->m_numTriangles << 3);
    }
    if (plVar11[5] == 0) {
      in_stack_ffffffffffffffd0->m_indices16 = (btShortIntIndexData *)0x0;
    }
    else {
      in_stack_ffffffffffffffc8 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (long)in_stack_ffffffffffffffcc;
      uVar9 = SUB168(auVar6 * ZEXT816(4),0);
      if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pbVar16 = (btShortIntIndexData *)operator_new__(uVar9);
      in_stack_ffffffffffffffd0->m_indices16 = pbVar16;
      memcpy(in_stack_ffffffffffffffd0->m_indices16,(void *)plVar11[5],
             (long)in_stack_ffffffffffffffcc << 2);
    }
    if (((in_stack_ffffffffffffffc8 & 0x1000000) == 0) && (plVar11[4] != 0)) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)in_stack_ffffffffffffffd0->m_numTriangles;
      uVar9 = SUB168(auVar7 * ZEXT816(4),0);
      if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      pbVar17 = (btCharIndexTripletData *)operator_new__(uVar9);
      in_stack_ffffffffffffffd0->m_3indices8 = pbVar17;
      memcpy(in_stack_ffffffffffffffd0->m_3indices8,(void *)plVar11[4],
             (long)in_stack_ffffffffffffffd0->m_numTriangles << 2);
    }
    else {
      in_stack_ffffffffffffffd0->m_3indices8 = (btCharIndexTripletData *)0x0;
    }
  }
  btAlignedObjectArray<btStridingMeshInterfaceData_*>::push_back
            ((btAlignedObjectArray<btStridingMeshInterfaceData_*> *)in_stack_ffffffffffffffd0,
             (btStridingMeshInterfaceData **)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return pbVar8;
}

Assistant:

btStridingMeshInterfaceData* btCollisionWorldImporter::createStridingMeshInterfaceData(btStridingMeshInterfaceData* interfaceData)
{
	//create a new btStridingMeshInterfaceData that is an exact copy of shapedata and store it in the WorldImporter
	btStridingMeshInterfaceData* newData = new btStridingMeshInterfaceData;

	newData->m_scaling = interfaceData->m_scaling;
	newData->m_numMeshParts = interfaceData->m_numMeshParts;
	newData->m_meshPartsPtr = new btMeshPartData[newData->m_numMeshParts];

	for(int i = 0;i < newData->m_numMeshParts;i++)
	{
		btMeshPartData* curPart = &interfaceData->m_meshPartsPtr[i];
		btMeshPartData* curNewPart = &newData->m_meshPartsPtr[i];

		curNewPart->m_numTriangles = curPart->m_numTriangles;
		curNewPart->m_numVertices = curPart->m_numVertices;

		if(curPart->m_vertices3f)
		{
			curNewPart->m_vertices3f = new btVector3FloatData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3f,curPart->m_vertices3f,sizeof(btVector3FloatData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3f = NULL;

		if(curPart->m_vertices3d)
		{
			curNewPart->m_vertices3d = new btVector3DoubleData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3d,curPart->m_vertices3d,sizeof(btVector3DoubleData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3d = NULL;

		int numIndices = curNewPart->m_numTriangles * 3;
		///the m_3indices8 was not initialized in some Bullet versions, this can cause crashes at loading time
		///we catch it by only dealing with m_3indices8 if none of the other indices are initialized
		bool uninitialized3indices8Workaround =false;

		if(curPart->m_indices32)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_indices32 = new btIntIndexData[numIndices];
			memcpy(curNewPart->m_indices32,curPart->m_indices32,sizeof(btIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices32 = NULL;

		if(curPart->m_3indices16)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_3indices16 = new btShortIntIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices16,curPart->m_3indices16,sizeof(btShortIntIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices16 = NULL;

		if(curPart->m_indices16)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_indices16 = new btShortIntIndexData[numIndices];
			memcpy(curNewPart->m_indices16,curPart->m_indices16,sizeof(btShortIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices16 = NULL;

		if(!uninitialized3indices8Workaround && curPart->m_3indices8)
		{
			curNewPart->m_3indices8 = new btCharIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices8,curPart->m_3indices8,sizeof(btCharIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices8 = NULL;

	}

	m_allocatedbtStridingMeshInterfaceDatas.push_back(newData);

	return(newData);
}